

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O2

maze_path * __thiscall
HBF::search(maze_path *__return_storage_ptr__,HBF *this,
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *grid,vector<double,_std::allocator<double>_> *start,
           vector<int,_std::allocator<int>_> *goal)

{
  pointer __src;
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double theta;
  pointer pvVar4;
  pointer piVar5;
  double *pdVar6;
  pointer pvVar7;
  int *piVar8;
  double __x;
  double __x_00;
  double __x_01;
  double dVar9;
  double dVar10;
  double theta_00;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  maze_s state;
  pointer pvVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ostream *poVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  vector<int,_std::allocator<int>_> *pvVar24;
  long lVar25;
  int i;
  ulong uVar26;
  double dVar27;
  double dVar28;
  double __x_02;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  initializer_list<HBF::maze_s> __l;
  allocator_type local_1aa;
  allocator_type local_1a9;
  HBF *local_1a8;
  int local_19c;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> opened;
  maze_s local_178;
  vector<int,_std::allocator<int>_> *local_158;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  came_from;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> next_state;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  closed_value;
  undefined4 local_d8;
  undefined4 uStack_d4;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  closed;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 local_68;
  undefined4 uStack_64;
  
  iVar15 = this->NUM_THETA_CELLS;
  pvVar4 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar25 = *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar5 = *(pointer *)
            ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  local_1a8 = this;
  local_158 = goal;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            ((vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)&closed_value,
             ((long)(grid->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18,
             (allocator_type *)&came_from);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
            *)&local_178,(long)piVar5 - lVar25 >> 2,(value_type *)&closed_value,
           (allocator_type *)&opened);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector(&closed,(long)iVar15,(value_type *)&local_178,(allocator_type *)&next_state);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::~vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
             *)&local_178);
  std::_Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~_Vector_base
            ((_Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_> *)&closed_value);
  iVar15 = local_1a8->NUM_THETA_CELLS;
  pvVar4 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar25 = *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar5 = *(pointer *)
            ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&came_from,
             ((long)(grid->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18,
             (allocator_type *)&opened);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_178,(long)piVar5 - lVar25 >> 2,(value_type *)&came_from,
           (allocator_type *)&next_state);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&closed_value,(long)iVar15,(value_type *)&local_178,&local_1aa);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_178);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&came_from);
  iVar15 = local_1a8->NUM_THETA_CELLS;
  pvVar4 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar25 = *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar5 = *(pointer *)
            ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&opened,((long)(grid->
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18,
             (allocator_type *)&next_state);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
            *)&local_178,(long)piVar5 - lVar25 >> 2,&opened,(allocator_type *)&local_1aa);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector(&came_from,(long)iVar15,(value_type *)&local_178,&local_1a9);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::~vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
             *)&local_178);
  std::_Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~_Vector_base
            (&opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>);
  iVar15 = theta_to_stack_number
                     (local_1a8,
                      (start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[2]);
  pdVar6 = (start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar7 = closed.
           super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar15].
           super__Vector_base<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __x_02 = *pdVar6;
  __x_01 = pdVar6[1];
  dVar27 = floor(__x_02);
  iVar16 = (int)dVar27;
  dVar27 = floor(__x_01);
  lVar25 = *(long *)&pvVar7[iVar16].super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                     _M_impl.super__Vector_impl_data;
  lVar22 = (long)(int)dVar27 * 0x20;
  *(undefined8 *)(lVar25 + lVar22) = 0;
  pdVar6 = (double *)(lVar25 + 8 + lVar22);
  *pdVar6 = __x_02;
  pdVar6[1] = __x_01;
  *(undefined4 *)
   (*(long *)&closed_value.
              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar15].
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar16].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
   (long)(int)dVar27 * 4) = 1;
  lVar25 = *(long *)&came_from.
                     super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar15].
                     super__Vector_base<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar16].
                     super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                     super__Vector_impl_data;
  *(undefined8 *)(lVar25 + lVar22) = 0;
  pdVar6 = (double *)(lVar25 + 8 + lVar22);
  *pdVar6 = __x_02;
  pdVar6[1] = __x_01;
  local_178.g = 0.0;
  __l._M_len = 1;
  __l._M_array = &local_178;
  local_178.x = __x_02;
  local_178.y = __x_01;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&opened,__l,(allocator_type *)&next_state);
  local_19c = 1;
  pvVar24 = local_158;
  do {
    if (opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
        super__Vector_impl_data._M_start ==
        opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar20 = std::operator<<((ostream *)&std::cout,"no valid path.");
      std::endl<char,std::char_traits<char>>(poVar20);
      (__return_storage_ptr__->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(&__return_storage_ptr__->closed,&closed);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(&__return_storage_ptr__->came_from,&came_from);
      lVar25 = 0x40;
      lVar22 = 0x38;
      local_d8 = 0;
      uStack_d4 = 0;
      lVar19 = 0x30;
      local_68 = SUB84(__x_01,0);
      uStack_64 = (undefined4)((ulong)__x_01 >> 0x20);
      local_78 = local_68;
      uStack_74 = uStack_64;
LAB_001036f5:
      *(ulong *)((long)&(__return_storage_ptr__->closed).
                        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar19) =
           CONCAT44(uStack_d4,local_d8);
      *(double *)
       ((long)&(__return_storage_ptr__->closed).
               super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar22) = __x_02;
      *(ulong *)((long)&(__return_storage_ptr__->closed).
                        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar25) =
           CONCAT44(uStack_74,local_78);
      std::_Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~_Vector_base
                (&opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::~vector(&came_from);
      std::
      vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
      ::~vector(&closed_value);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::~vector(&closed);
      return __return_storage_ptr__;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<HBF::maze_s*,std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>>,__gnu_cxx::__ops::_Iter_comp_iter<comparator>>
              ();
    dVar27 = (opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_start)->g;
    dVar9 = (opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
             super__Vector_impl_data._M_start)->x;
    dVar10 = (opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_start)->y;
    theta_00 = (opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                super__Vector_impl_data._M_start)->theta;
    state = *opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
             super__Vector_impl_data._M_start;
    __src = opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
    if (__src != opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      memmove(opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_start,__src,
              (long)opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
    super__Vector_impl_data._M_finish =
         opened.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    piVar8 = (pvVar24->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((*piVar8 == (int)dVar9) && (piVar8[1] == (int)dVar10)) {
      poVar20 = std::operator<<((ostream *)&std::cout,"found path to goal in ");
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_19c);
      poVar20 = std::operator<<(poVar20," expansions");
      std::endl<char,std::char_traits<char>>(poVar20);
      (__return_storage_ptr__->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->came_from).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->closed).
      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(&__return_storage_ptr__->closed,&closed);
      std::
      vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
      ::operator=(&__return_storage_ptr__->came_from,&came_from);
      (__return_storage_ptr__->final).g = dVar27;
      lVar25 = 0x48;
      lVar22 = 0x40;
      lVar19 = 0x38;
      local_78 = SUB84(theta_00,0);
      uStack_74 = (undefined4)((ulong)theta_00 >> 0x20);
      local_d8 = SUB84(dVar9,0);
      uStack_d4 = (undefined4)((ulong)dVar9 >> 0x20);
      __x_02 = dVar10;
      goto LAB_001036f5;
    }
    expand(&next_state,local_1a8,state);
    lVar25 = 0;
    for (uVar26 = 0;
        uVar26 < (ulong)((long)next_state.
                               super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)next_state.
                               super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl
                               .super__Vector_impl_data._M_start >> 5); uVar26 = uVar26 + 1) {
      piVar8 = (pvVar24->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = (int)dVar9 - *piVar8;
      iVar15 = -iVar16;
      if (0 < iVar16) {
        iVar15 = iVar16;
      }
      iVar21 = (int)dVar10 - piVar8[1];
      iVar16 = -iVar21;
      if (0 < iVar21) {
        iVar16 = iVar21;
      }
      iVar21 = theta_to_stack_number(local_1a8,theta_00);
      auVar30 = *(undefined1 (*) [16])
                 ((long)&(next_state.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                          _M_impl.super__Vector_impl_data._M_start)->x + lVar25);
      __x = auVar30._0_8_;
      if (0.0 <= __x) {
        pvVar4 = (grid->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar22 = ((long)(grid->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18;
        auVar29._8_4_ = (int)((ulong)lVar22 >> 0x20);
        auVar29._0_8_ = lVar22;
        auVar29._12_4_ = 0x45300000;
        if (((__x < (auVar29._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar22) - 4503599627370496.0)) &&
            (__x_00 = auVar30._8_8_, 0.0 <= __x_00)) &&
           (lVar22 = (long)*(pointer *)
                            ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data + 8) -
                     *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data, lVar19 = lVar22 >> 2,
           auVar30._8_4_ = (int)(lVar22 >> 0x22), auVar30._0_8_ = lVar19,
           auVar30._12_4_ = 0x45300000,
           __x_00 < (auVar30._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0))) {
          dVar3 = *(double *)
                   ((long)&(next_state.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                            ._M_impl.super__Vector_impl_data._M_start)->g + lVar25);
          theta = *(double *)
                   ((long)&(next_state.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                            ._M_impl.super__Vector_impl_data._M_start)->theta + lVar25);
          iVar17 = theta_to_stack_number(local_1a8,theta);
          pvVar14 = closed_value.
                    super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar28 = floor(__x);
          iVar18 = (int)dVar28;
          pvVar4 = pvVar14[iVar17].
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar28 = floor(__x_00);
          pvVar24 = local_158;
          lVar22 = (long)(int)dVar28;
          if ((*(int *)(*(long *)&pvVar4[iVar18].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + lVar22 * 4) == 0) &&
             (*(int *)(*(long *)&(grid->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar18].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + lVar22 * 4) == 0)) {
            local_178.g = SQRT((double)(iVar21 / 0xf) * (double)(iVar21 / 0xf) +
                               (double)iVar16 * (double)iVar16 + (double)iVar15 * (double)iVar15) +
                          dVar3;
            local_178.x = __x;
            local_178.y = __x_00;
            local_178.theta = theta;
            std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::push_back(&opened,&local_178);
            lVar19 = *(long *)&closed.
                               super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar17].
                               super__Vector_base<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar18].
                               super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl
                               .super__Vector_impl_data;
            lVar23 = lVar22 * 0x20;
            puVar1 = (undefined8 *)
                     ((long)&(next_state.
                              super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                              super__Vector_impl_data._M_start)->g + lVar25);
            uVar11 = *puVar1;
            uVar12 = puVar1[1];
            puVar1 = (undefined8 *)
                     ((long)&(next_state.
                              super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                              super__Vector_impl_data._M_start)->y + lVar25);
            uVar13 = puVar1[1];
            puVar2 = (undefined8 *)(lVar19 + 0x10 + lVar23);
            *puVar2 = *puVar1;
            puVar2[1] = uVar13;
            puVar1 = (undefined8 *)(lVar19 + lVar23);
            *puVar1 = uVar11;
            puVar1[1] = uVar12;
            *(undefined4 *)
             (*(long *)&closed_value.
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar17].
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar18].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + lVar22 * 4) = 1;
            lVar22 = *(long *)&came_from.
                               super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar17].
                               super__Vector_base<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar18].
                               super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl
                               .super__Vector_impl_data;
            pdVar6 = (double *)(lVar22 + lVar23);
            *pdVar6 = dVar27;
            pdVar6[1] = dVar9;
            pdVar6 = (double *)(lVar22 + 0x10 + lVar23);
            *pdVar6 = dVar10;
            pdVar6[1] = theta_00;
            local_19c = local_19c + 1;
          }
        }
      }
      lVar25 = lVar25 + 0x20;
    }
    std::_Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~_Vector_base
              (&next_state.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>);
  } while( true );
}

Assistant:

HBF::maze_path HBF::search(vector<vector<int> > grid, vector<double> start, vector<int> goal) {
    /*
    Working Implementation of breadth first search. Does NOT use a heuristic
    and as a result this is pretty inefficient. Try modifying this algorithm
    into hybrid A* by adding heuristics appropriately.
    */

    vector<vector<vector<maze_s> > > closed(NUM_THETA_CELLS,
                                            vector<vector<maze_s>>(grid[0].size(), vector<maze_s>(grid.size())));
    vector<vector<vector<int> > > closed_value(NUM_THETA_CELLS,
                                               vector<vector<int>>(grid[0].size(), vector<int>(grid.size())));
    vector<vector<vector<maze_s> > > came_from(NUM_THETA_CELLS,
                                               vector<vector<maze_s>>(grid[0].size(), vector<maze_s>(grid.size())));
    double theta = start[2];
    int stack = theta_to_stack_number(theta);
    double g = 0;

    maze_s state;
    state.g = g;
    state.x = start[0];
    state.y = start[1];

    closed[stack][idx(state.x)][idx(state.y)] = state;
    closed_value[stack][idx(state.x)][idx(state.y)] = 1;
    came_from[stack][idx(state.x)][idx(state.y)] = state;
    int total_closed = 1;
    vector<maze_s> opened = {state};
    bool finished = false;

    // add my heuristic function
    // If you have one h value per cell then multiple states in that cell will have the same g+h value,
    // making it difficult to determine which is the better state.

//    vector<vector<int> > heuristic = heuristic_basic(grid, start, goal);
//    vector<vector<double> > heuristic = heuristic_nhh_euclidean(grid, goal);
//    vector<vector<double> > heuristic = heuristic_nhh_manhattan(grid, goal);


    while (!opened.empty()) {

        int length = opened.size();
        sort(opened.begin(), opened.end(), comparator());


        maze_s next = opened[0]; //grab first element
        opened.erase(opened.begin()); //pop first element

        int x = next.x;
        int y = next.y;

        if (idx(x) == goal[0] && idx(y) == goal[1]) {
            cout << "found path to goal in " << total_closed << " expansions" << endl;
            maze_path path;
            path.closed = closed;
            path.came_from = came_from;
            path.final = next;
            return path;

        }
        vector<maze_s> next_state = expand(next);

        for (int i = 0; i < next_state.size(); i++) {
            double h;
//            h = heuristic[x][y];
            h = sqrt(pow(abs(x-goal[0]),2)+pow(abs(y-goal[1]),2)+pow(theta_to_stack_number(next.theta)/15,2));
//            h = 0;
            double g2 = next_state[i].g + h;
            double x2 = next_state[i].x;
            double y2 = next_state[i].y;
            double theta2 = next_state[i].theta;

            if ((x2 < 0 || x2 >= grid.size()) || (y2 < 0 || y2 >= grid[0].size())) {
                //invalid cell
                continue;
            }
            int stack2 = theta_to_stack_number(theta2);

            if (closed_value[stack2][idx(x2)][idx(y2)] == 0 && grid[idx(x2)][idx(y2)] == 0) {

                maze_s state2;
                state2.g = g2;
                state2.x = x2;
                state2.y = y2;
                state2.theta = theta2;

                opened.push_back(state2);

                closed[stack2][idx(x2)][idx(y2)] = next_state[i];
                closed_value[stack2][idx(x2)][idx(y2)] = 1;
                came_from[stack2][idx(x2)][idx(y2)] = next;
                total_closed += 1;
            }


        }

    }
    cout << "no valid path." << endl;
    HBF::maze_path path;
    path.closed = closed;
    path.came_from = came_from;
    path.final = state;
    return path;

}